

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine_test.c
# Opt level: O0

int test_error(void)

{
  int iVar1;
  statemachine_definition *psVar2;
  statemachine_ctx *psVar3;
  char *pcVar4;
  int res;
  statemachine_ctx *sm;
  statemachine_definition *def;
  
  psVar2 = statemachine_definition_new(10);
  psVar3 = statemachine_new(psVar2,(void *)0x0);
  statemachine_definition_populate(psVar2,simple_state_transitions,(char **)0x0);
  if (psVar3->current_state != 0) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x7c,"sm->current_state == SIMPLE_STATE_A");
    if (psVar3->current_state == 0) {
      exit(1);
    }
    __assert_fail("sm->current_state == SIMPLE_STATE_A",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x7c,"int test_error()");
  }
  pcVar4 = statemachine_get_error_msg(psVar3);
  if (pcVar4 != (char *)0x0) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x7e,"statemachine_get_error_msg(sm) == NULL");
    pcVar4 = statemachine_get_error_msg(psVar3);
    if (pcVar4 == (char *)0x0) {
      exit(1);
    }
    __assert_fail("statemachine_get_error_msg(sm) == ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x7e,"int test_error()");
  }
  iVar1 = statemachine_parse(psVar3,"00E",3);
  if (psVar3->current_state != 4) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x81,"sm->current_state == SIMPLE_STATE_ERROR_TEST");
    if (psVar3->current_state == 4) {
      exit(1);
    }
    __assert_fail("sm->current_state == SIMPLE_STATE_ERROR_TEST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x81,"int test_error()");
  }
  if (psVar3->current_state != iVar1) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x82,"sm->current_state == res");
    if (psVar3->current_state == iVar1) {
      exit(1);
    }
    __assert_fail("sm->current_state == res",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x82,"int test_error()");
  }
  iVar1 = statemachine_parse(psVar3,"3",1);
  if (iVar1 != 0x7f) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x85,"res == STATEMACHINE_ERROR");
    if (iVar1 == 0x7f) {
      exit(1);
    }
    __assert_fail("res == STATEMACHINE_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x85,"int test_error()");
  }
  pcVar4 = statemachine_get_error_msg(psVar3);
  iVar1 = strcmp(pcVar4,"Unexpected character \'3\'");
  if (iVar1 != 0) {
    pcVar4 = statemachine_get_error_msg(psVar3);
    printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x87,pcVar4,"Unexpected character \'3\'");
    pcVar4 = statemachine_get_error_msg(psVar3);
    iVar1 = strcmp(pcVar4,"Unexpected character \'3\'");
    if (iVar1 == 0) {
      exit(1);
    }
    __assert_fail("!strcmp((statemachine_get_error_msg(sm)), (\"Unexpected character \'3\'\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x87,"int test_error()");
  }
  statemachine_reset(psVar3);
  pcVar4 = statemachine_get_error_msg(psVar3);
  if (pcVar4 != (char *)0x0) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x8a,"statemachine_get_error_msg(sm) == NULL");
    pcVar4 = statemachine_get_error_msg(psVar3);
    if (pcVar4 == (char *)0x0) {
      exit(1);
    }
    __assert_fail("statemachine_get_error_msg(sm) == ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x8a,"int test_error()");
  }
  statemachine_delete(psVar3);
  psVar2 = statemachine_definition_new(10);
  psVar3 = statemachine_new(psVar2,(void *)0x0);
  statemachine_definition_populate(psVar2,simple_state_transitions,simple_states_internal_names);
  if (psVar3->current_state != 0) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x93,"sm->current_state == SIMPLE_STATE_A");
    if (psVar3->current_state == 0) {
      exit(1);
    }
    __assert_fail("sm->current_state == SIMPLE_STATE_A",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x93,"int test_error()");
  }
  iVar1 = statemachine_parse(psVar3,"00E",3);
  if (psVar3->current_state != 4) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x96,"sm->current_state == SIMPLE_STATE_ERROR_TEST");
    if (psVar3->current_state == 4) {
      exit(1);
    }
    __assert_fail("sm->current_state == SIMPLE_STATE_ERROR_TEST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x96,"int test_error()");
  }
  if (psVar3->current_state != iVar1) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x97,"sm->current_state == res");
    if (psVar3->current_state == iVar1) {
      exit(1);
    }
    __assert_fail("sm->current_state == res",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x97,"int test_error()");
  }
  iVar1 = statemachine_parse(psVar3,"3",1);
  if (iVar1 != 0x7f) {
    printf("%s: %d: ASSERT FAILED: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
           ,0x9a,"res == STATEMACHINE_ERROR");
    if (iVar1 == 0x7f) {
      exit(1);
    }
    __assert_fail("res == STATEMACHINE_ERROR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x9a,"int test_error()");
  }
  pcVar4 = statemachine_get_error_msg(psVar3);
  iVar1 = strcmp(pcVar4,"Unexpected character \'3\' in state \'error_test\'");
  if (iVar1 == 0) {
    statemachine_delete(psVar3);
    return 0;
  }
  pcVar4 = statemachine_get_error_msg(psVar3);
  printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
         ,0x9c,pcVar4,"Unexpected character \'3\' in state \'error_test\'");
  pcVar4 = statemachine_get_error_msg(psVar3);
  iVar1 = strcmp(pcVar4,"Unexpected character \'3\' in state \'error_test\'");
  if (iVar1 == 0) {
    exit(1);
  }
  __assert_fail("!strcmp((statemachine_get_error_msg(sm)), (\"Unexpected character \'3\' in state \'error_test\'\"))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                ,0x9c,"int test_error()");
}

Assistant:

int test_error()
{
  statemachine_definition *def;
  statemachine_ctx *sm;
  int res;

  def = statemachine_definition_new(NUM_STATES);
  sm = statemachine_new(def, NULL);

  statemachine_definition_populate(def, simple_state_transitions,
                                   NULL);
  ASSERT(sm->current_state == SIMPLE_STATE_A);

  ASSERT(statemachine_get_error_msg(sm) == NULL);

  res = statemachine_parse_str(sm, "00E");
  ASSERT(sm->current_state == SIMPLE_STATE_ERROR_TEST);
  ASSERT(sm->current_state == res);

  res = statemachine_parse(sm, "3", 1);
  ASSERT(res == STATEMACHINE_ERROR);
  ASSERT_STREQ(statemachine_get_error_msg(sm),
               "Unexpected character '3'");

  statemachine_reset(sm);
  ASSERT(statemachine_get_error_msg(sm) == NULL);

  statemachine_delete(sm);

  def = statemachine_definition_new(NUM_STATES);
  sm = statemachine_new(def, NULL);

  statemachine_definition_populate(def, simple_state_transitions,
                                   simple_states_internal_names);
  ASSERT(sm->current_state == SIMPLE_STATE_A);

  res = statemachine_parse_str(sm, "00E");
  ASSERT(sm->current_state == SIMPLE_STATE_ERROR_TEST);
  ASSERT(sm->current_state == res);

  res = statemachine_parse(sm, "3", 1);
  ASSERT(res == STATEMACHINE_ERROR);
  ASSERT_STREQ(statemachine_get_error_msg(sm),
               "Unexpected character '3' in state 'error_test'");

  statemachine_delete(sm);

  return 0;
}